

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam2vcf.cpp
# Opt level: O1

void help(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"sam2vcf [OPTIONS]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "Converts the aligned calls (with bwa-mem) \'calls.sam\' of clust2snp into a vcf file \'calls.sam.vcf\'."
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Options:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"-h          Print this help.");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"-x          Disable non-isolated SNPs (default: enabled).");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"-s <arg>    Input SAM file. REQUIRED");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "-d <arg>    Keep only one indel in pairs within <arg> bases. Default: ")
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,indel_deduplicate_def);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"-e          Keep only exact alignments.");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(0);
}

Assistant:

void help(){

	cout << "sam2vcf [OPTIONS]" << endl << endl <<
	"Converts the aligned calls (with bwa-mem) 'calls.sam' of clust2snp into a vcf file 'calls.sam.vcf'." << endl <<
	"Options:" << endl <<
		"-h          Print this help." << endl <<
		"-x          Disable non-isolated SNPs (default: enabled)." << endl <<
		"-s <arg>    Input SAM file. REQUIRED" << endl <<
		"-d <arg>    Keep only one indel in pairs within <arg> bases. Default: " <<  indel_deduplicate_def << "." << endl <<
		"-e          Keep only exact alignments." << endl;
	exit(0);
}